

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_xvxsigdp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 dst;
  TCGv_i64 dst_00;
  TCGv_i64 ret_01;
  TCGv_i64 ret_02;
  TCGv_i64 c2;
  TCGv_i64 c2_00;
  uintptr_t o_5;
  uintptr_t o_3;
  uintptr_t o_1;
  uintptr_t o_2;
  uintptr_t o;
  
  if (ctx->vsx_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    ret = tcg_temp_new_i64(tcg_ctx);
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    dst = tcg_temp_new_i64(tcg_ctx);
    dst_00 = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx,dst,ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4);
    get_cpu_vsrl(tcg_ctx,dst_00,ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4);
    ret_01 = tcg_temp_new_i64(tcg_ctx);
    ret_02 = tcg_temp_new_i64(tcg_ctx);
    c2 = tcg_const_i64_ppc64(tcg_ctx,0);
    c2_00 = tcg_const_i64_ppc64(tcg_ctx,0x7ff);
    tcg_gen_extract_i64_ppc64(tcg_ctx,ret_01,dst,0x34,0xb);
    tcg_gen_movi_i64_ppc64(tcg_ctx,ret_02,0x10000000000000);
    tcg_gen_movcond_i64_ppc64(tcg_ctx,TCG_COND_EQ,ret_02,ret_01,c2,c2,ret_02);
    tcg_gen_movcond_i64_ppc64(tcg_ctx,TCG_COND_EQ,ret_02,ret_01,c2_00,c2,ret_02);
    tcg_gen_deposit_i64_ppc64(tcg_ctx,ret,ret_02,dst,0,0x34);
    set_cpu_vsrh(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,ret);
    tcg_gen_extract_i64_ppc64(tcg_ctx,ret_01,dst_00,0x34,0xb);
    tcg_gen_movi_i64_ppc64(tcg_ctx,ret_02,0x10000000000000);
    tcg_gen_movcond_i64_ppc64(tcg_ctx,TCG_COND_EQ,ret_02,ret_01,c2,c2,ret_02);
    tcg_gen_movcond_i64_ppc64(tcg_ctx,TCG_COND_EQ,ret_02,ret_01,c2_00,c2,ret_02);
    tcg_gen_deposit_i64_ppc64(tcg_ctx,ret_00,ret_02,dst_00,0,0x34);
    set_cpu_vsrl(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,ret_00);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_02 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(c2_00 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst_00 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xvxsigdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xbh;
    TCGv_i64 xbl;
    TCGv_i64 t0, zr, nan, exp;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    xbl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xbh, xB(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xbl, xB(ctx->opcode));
    exp = tcg_temp_new_i64(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    zr = tcg_const_i64(tcg_ctx, 0);
    nan = tcg_const_i64(tcg_ctx, 2047);

    tcg_gen_extract_i64(tcg_ctx, exp, xbh, 52, 11);
    tcg_gen_movi_i64(tcg_ctx, t0, 0x0010000000000000);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, zr, zr, t0);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, nan, zr, t0);
    tcg_gen_deposit_i64(tcg_ctx, xth, t0, xbh, 0, 52);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);

    tcg_gen_extract_i64(tcg_ctx, exp, xbl, 52, 11);
    tcg_gen_movi_i64(tcg_ctx, t0, 0x0010000000000000);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, zr, zr, t0);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, nan, zr, t0);
    tcg_gen_deposit_i64(tcg_ctx, xtl, t0, xbl, 0, 52);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, exp);
    tcg_temp_free_i64(tcg_ctx, zr);
    tcg_temp_free_i64(tcg_ctx, nan);
    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xbl);
}